

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_copyCDictTableIntoCCtx
               (U32 *dst,U32 *src,size_t tableSize,ZSTD_compressionParameters *cParams)

{
  size_t i;
  size_t sVar1;
  
  if (cParams->strategy - ZSTD_greedy < 0xfffffffe) {
    memcpy(dst,src,tableSize << 2);
    return;
  }
  for (sVar1 = 0; tableSize != sVar1; sVar1 = sVar1 + 1) {
    dst[sVar1] = src[sVar1] >> 8;
  }
  return;
}

Assistant:

static void ZSTD_copyCDictTableIntoCCtx(U32* dst, U32 const* src, size_t tableSize,
                                        ZSTD_compressionParameters const* cParams) {
    if (ZSTD_CDictIndicesAreTagged(cParams)){
        /* Remove tags from the CDict table if they are present.
         * See docs on "short cache" in zstd_compress_internal.h for context. */
        size_t i;
        for (i = 0; i < tableSize; i++) {
            U32 const taggedIndex = src[i];
            U32 const index = taggedIndex >> ZSTD_SHORT_CACHE_TAG_BITS;
            dst[i] = index;
        }
    } else {
        ZSTD_memcpy(dst, src, tableSize * sizeof(U32));
    }
}